

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O2

void __thiscall
CLogger::Info<int,int,int,int>
          (CLogger *this,string_view fmt,int *args,int *args_1,int *args_2,int *args_3)

{
  format_string_t<int,_int,_int,_int> fmt_00;
  logger *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  spdlog::get((char *)&local_40);
  fmt_00.str_.size_ = fmt._M_len;
  fmt_00.str_.data_ = fmt._M_str;
  spdlog::logger::info<int,int,int,int>(local_40,fmt_00,args,args_1,args_2,args_3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void Info(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->info(fmt, std::forward<Args>(args)...);
	}